

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record_R_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Record_R_PDU::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,Record_R_PDU *this)

{
  pointer pRVar1;
  ostream *poVar2;
  KINT32 Value;
  pointer pRVar3;
  ulong uVar4;
  char cVar5;
  KString local_3a0;
  KString local_380;
  KString local_360;
  undefined1 local_340 [392];
  KStringStream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  Header7::GetAsString_abi_cxx11_((KString *)local_340,(Header7 *)this);
  poVar2 = std::operator<<(local_1a8,(string *)local_340);
  poVar2 = std::operator<<(poVar2,"-Record-R PDU-\n");
  Simulation_Management_Header::GetAsString_abi_cxx11_
            (&local_380,(Simulation_Management_Header *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_380);
  poVar2 = std::operator<<(poVar2,"\tRequest ID:                ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  Reliability_Header::GetAsString_abi_cxx11_
            (&local_3a0,&(this->super_Set_Record_R_PDU).super_Reliability_Header);
  poVar2 = std::operator<<(poVar2,(string *)&local_3a0);
  poVar2 = std::operator<<(poVar2,"\tEvent Type:                ");
  DATA_TYPE::ENUMS::GetEnumAsStringEventType_abi_cxx11_
            (&local_360,(ENUMS *)(ulong)this->m_ui16EvntTyp,Value);
  poVar2 = std::operator<<(poVar2,(string *)&local_360);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tSerial Number:             ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tNumber Of record Sets:     ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)local_340);
  pRVar1 = (this->super_Set_Record_R_PDU).m_vRecs.
           super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  poVar2 = (ostream *)(local_340 + 0x10);
  for (pRVar3 = (this->super_Set_Record_R_PDU).m_vRecs.
                super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>
                ._M_impl.super__Vector_impl_data._M_start; pRVar3 != pRVar1; pRVar3 = pRVar3 + 1) {
    (*(pRVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_3a0,pRVar3);
    std::__cxx11::stringstream::stringstream((stringstream *)local_340);
    std::operator<<(poVar2,'\t');
    uVar4 = 0;
    while( true ) {
      uVar4 = uVar4 & 0xffff;
      if (local_3a0._M_string_length <= uVar4) break;
      cVar5 = local_3a0._M_dataplus._M_p[uVar4];
      if (local_3a0._M_string_length - 1 != uVar4 && cVar5 == '\n') {
        cVar5 = '\t';
        std::operator<<(poVar2,'\n');
      }
      std::operator<<(poVar2,cVar5);
      uVar4 = (ulong)((int)uVar4 + 1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::operator<<(local_1a8,(string *)&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_3a0);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

KString Record_R_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Record-R PDU-\n"
       << Simulation_Management_Header::GetAsString()
       << "\tRequest ID:                "   << m_ui32RqId
       << Reliability_Header::GetAsString()
       << "\tEvent Type:                "   << GetEnumAsStringEventType( m_ui16EvntTyp ) << "\n"
       << "\tSerial Number:             "   << m_ui32SrlNm    << "\n"
       << "\tNumber Of record Sets:     " << m_ui32NumRecSets  << "\n";

    vector<RecordSet>::const_iterator citr = m_vRecs.begin();
    vector<RecordSet>::const_iterator citrEnd = m_vRecs.end();

    for( ; citr != citrEnd; ++citr )
    {
        ss << IndentString( citr->GetAsString(), 1 );
    }

    return ss.str();
}